

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error SW_FT_Stroker_BeginSubPath(SW_FT_Stroker stroker,SW_FT_Vector *to,SW_FT_Bool open)

{
  bool local_13;
  bool local_12;
  SW_FT_Bool open_local;
  SW_FT_Vector *to_local;
  SW_FT_Stroker stroker_local;
  
  stroker->first_point = '\x01';
  (stroker->center).x = to->x;
  (stroker->center).y = to->y;
  stroker->subpath_open = open;
  local_12 = true;
  if (stroker->line_join == SW_FT_STROKER_LINEJOIN_ROUND) {
    local_13 = false;
    if (stroker->subpath_open != '\0') {
      local_13 = stroker->line_cap == SW_FT_STROKER_LINECAP_BUTT;
    }
    local_12 = local_13;
  }
  stroker->handle_wide_strokes = local_12;
  (stroker->subpath_start).x = to->x;
  (stroker->subpath_start).y = to->y;
  stroker->angle_in = 0;
  return 0;
}

Assistant:

SW_FT_Error SW_FT_Stroker_BeginSubPath(SW_FT_Stroker stroker, SW_FT_Vector* to,
                                       SW_FT_Bool open)
{
    /* We cannot process the first point, because there is not enough      */
    /* information regarding its corner/cap.  The latter will be processed */
    /* in the `SW_FT_Stroker_EndSubPath' routine.                             */
    /*                                                                     */
    stroker->first_point = TRUE;
    stroker->center = *to;
    stroker->subpath_open = open;

    /* Determine if we need to check whether the border radius is greater */
    /* than the radius of curvature of a curve, to handle this case       */
    /* specially.  This is only required if bevel joins or butt caps may  */
    /* be created, because round & miter joins and round & square caps    */
    /* cover the negative sector created with wide strokes.               */
    stroker->handle_wide_strokes =
        SW_FT_BOOL(stroker->line_join != SW_FT_STROKER_LINEJOIN_ROUND ||
                   (stroker->subpath_open &&
                    stroker->line_cap == SW_FT_STROKER_LINECAP_BUTT));

    /* record the subpath start point for each border */
    stroker->subpath_start = *to;

    stroker->angle_in = 0;

    return 0;
}